

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

bool StringFormatter<long>::output_wchar<long>(ostream *os,long *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dst;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> wc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type *local_70;
  long local_68;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  undefined1 *local_30 [2];
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  _M_construct(&local_50,1,(wchar_t)*value);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_90,local_50._M_string_length << 2,'\0');
  utf32toutf8<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )local_30,
             (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )local_50._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_50._M_dataplus._M_p + local_50._M_string_length),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_90._M_dataplus._M_p);
  local_68 = (long)local_30[0] - (long)local_90._M_dataplus._M_p;
  *local_30[0] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    uStack_58 = local_90.field_2._8_8_;
    local_70 = &local_60;
  }
  else {
    local_70 = (size_type *)local_90._M_dataplus._M_p;
  }
  local_60 = local_90.field_2._M_allocated_capacity;
  local_90._M_string_length = 0;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
  }
  return true;
}

Assistant:

static bool output_wchar(std::ostream& os, const T& value)
    { 
        if constexpr (std::is_integral_v<T>) {
            std::basic_string<wchar_t> wc(1, wchar_t(value));
            os << string::convert<char>(wc);
            return true;
        }
        return false;
    }